

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::TemplatedIndexOfHelper<false,Js::RecyclableObject,unsigned_int>
              (RecyclableObject *pArr,Var search,uint fromIndex,uint toIndex,
              ScriptContext *scriptContext)

{
  bool bVar1;
  bool bVar2;
  BOOL BVar3;
  JavascriptLibrary *pJVar4;
  Var pvVar5;
  uint local_54;
  uint i;
  Var falseValue;
  Var trueValue;
  bool doUndefinedSearch;
  Var pvStack_38;
  bool isSearchTaggedInt;
  Var element;
  ScriptContext *scriptContext_local;
  uint toIndex_local;
  uint fromIndex_local;
  Var search_local;
  RecyclableObject *pArr_local;
  
  pvStack_38 = (Var)0x0;
  element = scriptContext;
  scriptContext_local._0_4_ = toIndex;
  scriptContext_local._4_4_ = fromIndex;
  _toIndex_local = search;
  search_local = pArr;
  bVar1 = TaggedInt::Is(search);
  pJVar4 = ScriptContext::GetLibrary((ScriptContext *)element);
  JavascriptLibraryBase::GetTrue(&pJVar4->super_JavascriptLibraryBase);
  pJVar4 = ScriptContext::GetLibrary((ScriptContext *)element);
  JavascriptLibraryBase::GetFalse(&pJVar4->super_JavascriptLibraryBase);
  local_54 = scriptContext_local._4_4_;
  do {
    if ((uint)scriptContext_local <= local_54) {
      pvVar5 = TaggedInt::ToVarUnchecked(-1);
      return pvVar5;
    }
    BVar3 = TryTemplatedGetItem<Js::RecyclableObject,unsigned_int>
                      ((RecyclableObject *)search_local,local_54,&stack0xffffffffffffffc8,
                       (ScriptContext *)element,true);
    if (BVar3 != 0) {
      if ((bVar1) && (bVar2 = TaggedInt::Is(pvStack_38), bVar2)) {
        if (pvStack_38 == _toIndex_local) {
          pvVar5 = JavascriptNumber::ToVar(local_54,(ScriptContext *)element);
          return pvVar5;
        }
      }
      else {
        BVar3 = Js::JavascriptOperators::StrictEqual
                          (pvStack_38,_toIndex_local,(ScriptContext *)element);
        if (BVar3 != 0) {
          pvVar5 = JavascriptNumber::ToVar(local_54,(ScriptContext *)element);
          return pvVar5;
        }
      }
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

Var JavascriptArray::TemplatedIndexOfHelper(T * pArr, Var search, P fromIndex, P toIndex, ScriptContext * scriptContext)
    {
        Var element = nullptr;
        bool isSearchTaggedInt = TaggedInt::Is(search);
        bool doUndefinedSearch = includesAlgorithm && JavascriptOperators::GetTypeId(search) == TypeIds_Undefined;

        Var trueValue = scriptContext->GetLibrary()->GetTrue();
        Var falseValue = scriptContext->GetLibrary()->GetFalse();

        //Consider: enumerating instead of walking all indices
        for (P i = fromIndex; i < toIndex; i++)
        {
            if (!TryTemplatedGetItem<T>(pArr, i, &element, scriptContext, !includesAlgorithm))
            {
                if (doUndefinedSearch)
                {
                    return trueValue;
                }
                continue;
            }

            if (isSearchTaggedInt && TaggedInt::Is(element))
            {
                if (element == search)
                {
                    return includesAlgorithm? trueValue : JavascriptNumber::ToVar(i, scriptContext);
                }
                continue;
            }

            if (includesAlgorithm)
            {
                //Array.prototype.includes
                if (JavascriptConversion::SameValueZero(element, search))
                {
                    return trueValue;
                }
            }
            else
            {
                //Array.prototype.indexOf
                if (JavascriptOperators::StrictEqual(element, search, scriptContext))
                {
                    return JavascriptNumber::ToVar(i, scriptContext);
                }
            }
        }

        return includesAlgorithm ? falseValue :  TaggedInt::ToVarUnchecked(-1);
    }